

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O3

void cnn::TensorTools::Constant(Tensor *d,float c)

{
  float *pfVar1;
  float *__s;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ushort uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  int iVar35;
  undefined1 in_register_00001204 [60];
  
  auVar34._4_60_ = in_register_00001204;
  auVar34._0_4_ = c;
  __s = d->v;
  uVar23 = (ulong)(d->d).nd;
  if (c != 0.0) {
    if (uVar23 == 0) {
      iVar35 = 1;
    }
    else {
      auVar28 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar31 = vpbroadcastq_avx512f();
      uVar25 = 0;
      do {
        auVar32 = vpbroadcastq_avx512f();
        auVar33 = vmovdqa64_avx512f(auVar28);
        auVar28 = vporq_avx512f(auVar32,auVar29);
        auVar32 = vporq_avx512f(auVar32,auVar30);
        uVar18 = vpcmpuq_avx512f(auVar32,auVar31,2);
        bVar20 = (byte)uVar18;
        uVar18 = vpcmpuq_avx512f(auVar28,auVar31,2);
        bVar21 = (byte)uVar18;
        uVar26 = CONCAT11(bVar21,bVar20);
        auVar28 = vmovdqu32_avx512f(*(undefined1 (*) [64])((d->d).d + uVar25));
        auVar32._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar28._4_4_;
        auVar32._0_4_ = (uint)(bVar20 & 1) * auVar28._0_4_;
        auVar32._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar28._8_4_;
        auVar32._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar28._12_4_;
        auVar32._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar28._16_4_;
        auVar32._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar28._20_4_;
        auVar32._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar28._24_4_;
        auVar32._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar28._28_4_;
        auVar32._32_4_ = (uint)(bVar21 & 1) * auVar28._32_4_;
        auVar32._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar28._36_4_;
        auVar32._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar28._40_4_;
        auVar32._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar28._44_4_;
        auVar32._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar28._48_4_;
        auVar32._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar28._52_4_;
        auVar32._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar28._56_4_;
        auVar32._60_4_ = (uint)(bVar21 >> 7) * auVar28._60_4_;
        uVar25 = uVar25 + 0x10;
        auVar28 = vpmulld_avx512f(auVar32,auVar33);
      } while ((uVar23 + 0xf & 0xfffffffffffffff0) != uVar25);
      auVar28 = vmovdqa32_avx512f(auVar28);
      auVar29._0_4_ = (uint)(bVar20 & 1) * auVar28._0_4_ | (uint)!(bool)(bVar20 & 1) * auVar33._0_4_
      ;
      bVar2 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar29._4_4_ = (uint)bVar2 * auVar28._4_4_ | (uint)!bVar2 * auVar33._4_4_;
      bVar2 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar29._8_4_ = (uint)bVar2 * auVar28._8_4_ | (uint)!bVar2 * auVar33._8_4_;
      bVar2 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar29._12_4_ = (uint)bVar2 * auVar28._12_4_ | (uint)!bVar2 * auVar33._12_4_;
      bVar2 = (bool)((byte)(uVar26 >> 4) & 1);
      auVar29._16_4_ = (uint)bVar2 * auVar28._16_4_ | (uint)!bVar2 * auVar33._16_4_;
      bVar2 = (bool)((byte)(uVar26 >> 5) & 1);
      auVar29._20_4_ = (uint)bVar2 * auVar28._20_4_ | (uint)!bVar2 * auVar33._20_4_;
      bVar2 = (bool)((byte)(uVar26 >> 6) & 1);
      auVar29._24_4_ = (uint)bVar2 * auVar28._24_4_ | (uint)!bVar2 * auVar33._24_4_;
      bVar2 = (bool)((byte)(uVar26 >> 7) & 1);
      auVar29._28_4_ = (uint)bVar2 * auVar28._28_4_ | (uint)!bVar2 * auVar33._28_4_;
      auVar29._32_4_ =
           (uint)(bVar21 & 1) * auVar28._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar33._32_4_;
      bVar2 = (bool)(bVar21 >> 1 & 1);
      auVar29._36_4_ = (uint)bVar2 * auVar28._36_4_ | (uint)!bVar2 * auVar33._36_4_;
      bVar2 = (bool)(bVar21 >> 2 & 1);
      auVar29._40_4_ = (uint)bVar2 * auVar28._40_4_ | (uint)!bVar2 * auVar33._40_4_;
      bVar2 = (bool)(bVar21 >> 3 & 1);
      auVar29._44_4_ = (uint)bVar2 * auVar28._44_4_ | (uint)!bVar2 * auVar33._44_4_;
      bVar2 = (bool)(bVar21 >> 4 & 1);
      auVar29._48_4_ = (uint)bVar2 * auVar28._48_4_ | (uint)!bVar2 * auVar33._48_4_;
      bVar2 = (bool)(bVar21 >> 5 & 1);
      auVar29._52_4_ = (uint)bVar2 * auVar28._52_4_ | (uint)!bVar2 * auVar33._52_4_;
      bVar2 = (bool)(bVar21 >> 6 & 1);
      auVar29._56_4_ = (uint)bVar2 * auVar28._56_4_ | (uint)!bVar2 * auVar33._56_4_;
      auVar29._60_4_ =
           (uint)(bVar21 >> 7) * auVar28._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar33._60_4_;
      auVar27 = vextracti64x4_avx512f(auVar29,1);
      auVar28 = vpmulld_avx512f(auVar29,ZEXT3264(auVar27));
      auVar16 = vpmulld_avx(auVar28._0_16_,auVar28._16_16_);
      auVar17 = vpshufd_avx(auVar16,0xee);
      auVar16 = vpmulld_avx(auVar16,auVar17);
      auVar17 = vpshufd_avx(auVar16,0x55);
      auVar16 = vpmulld_avx(auVar16,auVar17);
      iVar35 = auVar16._0_4_;
    }
    uVar22 = iVar35 * (d->d).bd;
    if (uVar22 != 0) {
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar34 = vbroadcastss_avx512f(auVar34._0_16_);
      uVar23 = (ulong)uVar22 + 0x3fffffffffffffff;
      auVar30 = vpbroadcastq_avx512f();
      lVar24 = 0;
      do {
        auVar31 = vpbroadcastq_avx512f();
        auVar32 = vporq_avx512f(auVar31,auVar28);
        auVar31 = vporq_avx512f(auVar31,auVar29);
        uVar18 = vpcmpuq_avx512f(auVar31,auVar30,2);
        uVar19 = vpcmpuq_avx512f(auVar32,auVar30,2);
        bVar20 = (byte)uVar19;
        uVar26 = CONCAT11(bVar20,(byte)uVar18);
        pfVar1 = __s + lVar24;
        bVar2 = (bool)((byte)uVar18 & 1);
        bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
        bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
        bVar10 = (bool)(bVar20 >> 1 & 1);
        bVar11 = (bool)(bVar20 >> 2 & 1);
        bVar12 = (bool)(bVar20 >> 3 & 1);
        bVar13 = (bool)(bVar20 >> 4 & 1);
        bVar14 = (bool)(bVar20 >> 5 & 1);
        bVar15 = (bool)(bVar20 >> 6 & 1);
        *pfVar1 = (float)((uint)bVar2 * auVar34._0_4_ | (uint)!bVar2 * (int)*pfVar1);
        pfVar1[1] = (float)((uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
        pfVar1[2] = (float)((uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
        pfVar1[3] = (float)((uint)bVar5 * auVar34._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
        pfVar1[4] = (float)((uint)bVar6 * auVar34._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
        pfVar1[5] = (float)((uint)bVar7 * auVar34._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
        pfVar1[6] = (float)((uint)bVar8 * auVar34._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
        pfVar1[7] = (float)((uint)bVar9 * auVar34._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
        pfVar1[8] = (float)((uint)(bVar20 & 1) * auVar34._32_4_ |
                           (uint)!(bool)(bVar20 & 1) * (int)pfVar1[8]);
        pfVar1[9] = (float)((uint)bVar10 * auVar34._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
        pfVar1[10] = (float)((uint)bVar11 * auVar34._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
        pfVar1[0xb] = (float)((uint)bVar12 * auVar34._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
        pfVar1[0xc] = (float)((uint)bVar13 * auVar34._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
        pfVar1[0xd] = (float)((uint)bVar14 * auVar34._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
        pfVar1[0xe] = (float)((uint)bVar15 * auVar34._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
        pfVar1[0xf] = (float)((uint)(bVar20 >> 7) * auVar34._60_4_ |
                             (uint)!(bool)(bVar20 >> 7) * (int)pfVar1[0xf]);
        lVar24 = lVar24 + 0x10;
      } while (((uVar23 & 0x3fffffffffffffff) + 0x10) - (ulong)((uint)uVar23 & 0xf) != lVar24);
    }
    return;
  }
  if (uVar23 == 0) {
    iVar35 = 1;
  }
  else {
    auVar34 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar30 = vpbroadcastq_avx512f();
    uVar25 = 0;
    do {
      auVar31 = vpbroadcastq_avx512f();
      auVar32 = vmovdqa64_avx512f(auVar34);
      auVar34 = vporq_avx512f(auVar31,auVar28);
      auVar31 = vporq_avx512f(auVar31,auVar29);
      uVar18 = vpcmpuq_avx512f(auVar31,auVar30,2);
      bVar20 = (byte)uVar18;
      uVar18 = vpcmpuq_avx512f(auVar34,auVar30,2);
      bVar21 = (byte)uVar18;
      uVar26 = CONCAT11(bVar21,bVar20);
      auVar34 = vmovdqu32_avx512f(*(undefined1 (*) [64])((d->d).d + uVar25));
      auVar31._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar34._4_4_;
      auVar31._0_4_ = (uint)(bVar20 & 1) * auVar34._0_4_;
      auVar31._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar34._8_4_;
      auVar31._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar34._12_4_;
      auVar31._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar34._16_4_;
      auVar31._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar34._20_4_;
      auVar31._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar34._24_4_;
      auVar31._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar34._28_4_;
      auVar31._32_4_ = (uint)(bVar21 & 1) * auVar34._32_4_;
      auVar31._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar34._36_4_;
      auVar31._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar34._40_4_;
      auVar31._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar34._44_4_;
      auVar31._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar34._48_4_;
      auVar31._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar34._52_4_;
      auVar31._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar34._56_4_;
      auVar31._60_4_ = (uint)(bVar21 >> 7) * auVar34._60_4_;
      uVar25 = uVar25 + 0x10;
      auVar34 = vpmulld_avx512f(auVar31,auVar32);
    } while ((uVar23 + 0xf & 0xfffffffffffffff0) != uVar25);
    auVar34 = vmovdqa32_avx512f(auVar34);
    auVar28._0_4_ = (uint)(bVar20 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar20 & 1) * auVar32._0_4_;
    bVar2 = (bool)((byte)(uVar26 >> 1) & 1);
    auVar28._4_4_ = (uint)bVar2 * auVar34._4_4_ | (uint)!bVar2 * auVar32._4_4_;
    bVar2 = (bool)((byte)(uVar26 >> 2) & 1);
    auVar28._8_4_ = (uint)bVar2 * auVar34._8_4_ | (uint)!bVar2 * auVar32._8_4_;
    bVar2 = (bool)((byte)(uVar26 >> 3) & 1);
    auVar28._12_4_ = (uint)bVar2 * auVar34._12_4_ | (uint)!bVar2 * auVar32._12_4_;
    bVar2 = (bool)((byte)(uVar26 >> 4) & 1);
    auVar28._16_4_ = (uint)bVar2 * auVar34._16_4_ | (uint)!bVar2 * auVar32._16_4_;
    bVar2 = (bool)((byte)(uVar26 >> 5) & 1);
    auVar28._20_4_ = (uint)bVar2 * auVar34._20_4_ | (uint)!bVar2 * auVar32._20_4_;
    bVar2 = (bool)((byte)(uVar26 >> 6) & 1);
    auVar28._24_4_ = (uint)bVar2 * auVar34._24_4_ | (uint)!bVar2 * auVar32._24_4_;
    bVar2 = (bool)((byte)(uVar26 >> 7) & 1);
    auVar28._28_4_ = (uint)bVar2 * auVar34._28_4_ | (uint)!bVar2 * auVar32._28_4_;
    auVar28._32_4_ =
         (uint)(bVar21 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar32._32_4_;
    bVar2 = (bool)(bVar21 >> 1 & 1);
    auVar28._36_4_ = (uint)bVar2 * auVar34._36_4_ | (uint)!bVar2 * auVar32._36_4_;
    bVar2 = (bool)(bVar21 >> 2 & 1);
    auVar28._40_4_ = (uint)bVar2 * auVar34._40_4_ | (uint)!bVar2 * auVar32._40_4_;
    bVar2 = (bool)(bVar21 >> 3 & 1);
    auVar28._44_4_ = (uint)bVar2 * auVar34._44_4_ | (uint)!bVar2 * auVar32._44_4_;
    bVar2 = (bool)(bVar21 >> 4 & 1);
    auVar28._48_4_ = (uint)bVar2 * auVar34._48_4_ | (uint)!bVar2 * auVar32._48_4_;
    bVar2 = (bool)(bVar21 >> 5 & 1);
    auVar28._52_4_ = (uint)bVar2 * auVar34._52_4_ | (uint)!bVar2 * auVar32._52_4_;
    bVar2 = (bool)(bVar21 >> 6 & 1);
    auVar28._56_4_ = (uint)bVar2 * auVar34._56_4_ | (uint)!bVar2 * auVar32._56_4_;
    auVar28._60_4_ =
         (uint)(bVar21 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar32._60_4_;
    auVar27 = vextracti64x4_avx512f(auVar28,1);
    auVar34 = vpmulld_avx512f(auVar28,ZEXT3264(auVar27));
    auVar16 = vpmulld_avx(auVar34._0_16_,auVar34._16_16_);
    auVar17 = vpshufd_avx(auVar16,0xee);
    auVar16 = vpmulld_avx(auVar16,auVar17);
    auVar17 = vpshufd_avx(auVar16,0x55);
    auVar16 = vpmulld_avx(auVar16,auVar17);
    iVar35 = auVar16._0_4_;
  }
  memset(__s,0,(ulong)(iVar35 * (d->d).bd) << 2);
  return;
}

Assistant:

void TensorTools::Constant(Tensor& d, float c) {
#if HAVE_CUDA
  if (!c) {
    CUDA_CHECK(cudaMemsetAsync(d.v, 0, d.d.size() * sizeof(float)));
  } else {
    fill(d.v, d.v + d.d.size(), c);
  }
#else
  if (!c) {
    memset(d.v, c, d.d.size() * sizeof(float));
  } else {
    fill(d.v, d.v + d.d.size(), c);
  }
#endif
}